

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

type * __thiscall
duckdb::Deserializer::
Read<duckdb::vector<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>,true>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  _func_int **local_30;
  
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*this->_vptr_Deserializer[8])(this);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    do {
      Read<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>,duckdb::Complex>
                ((Deserializer *)&stack0xffffffffffffffd0);
      std::
      vector<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>,std::allocator<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>>
      ::emplace_back<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>,std::allocator<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *)
                 &stack0xffffffffffffffd0);
      pp_Var1 = local_30;
      if (local_30 != (_func_int **)0x0) {
        if ((_func_int **)local_30[1] != local_30 + 3) {
          operator_delete(local_30[1]);
        }
        operator_delete(pp_Var1);
      }
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_vector<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_vector<T>::ELEMENT_TYPE;
		T vec;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			vec.push_back(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return vec;
	}